

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O0

void coll_tmap_clear(coll_tmap_t *map)

{
  entry_t_conflict *local_28;
  entry_t_conflict *cur;
  coll_seq_t seq;
  coll_tmap_t *map_local;
  
  seq.len = (size_t)map;
  coll_seq_init((coll_seq_t *)&cur);
  for (local_28 = entry_last(*(entry_t_conflict **)seq.len); local_28 != (entry_t_conflict *)0x0;
      local_28 = entry_prev(local_28)) {
    coll_seq_prepend((coll_seq_t *)&cur,local_28);
  }
  coll_seq_foreach((coll_seq_t *)&cur,free);
  coll_seq_free((coll_seq_t *)&cur);
  *(undefined8 *)seq.len = 0;
  *(undefined8 *)(seq.len + 8) = 0;
  return;
}

Assistant:

void coll_tmap_clear(coll_tmap_t *map) {
    coll_seq_t seq;
    coll_seq_init(&seq);
    entry_t *cur = entry_last(map->root);
    while (cur) {
        coll_seq_prepend(&seq, cur);
        cur = entry_prev(cur);
    }
    coll_seq_foreach(&seq, free);
    coll_seq_free(&seq);
    map->root = NULL;
    map->size = 0;
}